

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O1

double __thiscall
AbstractIsolineTracer<double>::determine_c_parametric(AbstractIsolineTracer<double> *this)

{
  double dVar1;
  double *pdVar2;
  void *__ptr;
  undefined8 *puVar3;
  int i;
  long lVar4;
  bool bVar5;
  vector<double,_std::allocator<double>_> rhovec;
  vector<double,_std::allocator<double>_> f;
  allocator_type local_41;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  
  if (this->mode != STEP_PARAMETRIC) {
    return 1.0;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_40,
             (this->m_initial_state).rhovecL.
             super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows * 2,
             (allocator_type *)&local_28);
  lVar4 = (this->m_initial_state).rhovecL.
          super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (0 < lVar4) {
    pdVar2 = (this->m_initial_state).rhovecL.
             super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    *local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *pdVar2;
    if (lVar4 != 1) {
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = pdVar2[1];
      lVar4 = (this->m_initial_state).rhovecV.
              super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (0 < lVar4) {
        pdVar2 = (this->m_initial_state).rhovecV.
                 super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[2] = *pdVar2;
        if (lVar4 != 1) {
          local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[3] = pdVar2[1];
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_28,
                     (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3,&local_41);
          (*(this->super_AbstractODEIntegrator)._vptr_AbstractODEIntegrator[5])
                    (this->m_T,this,&local_40,&local_28);
          __ptr = malloc(0x20);
          if (((ulong)__ptr & 0xf) != 0) {
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/util/Memory.h"
                          ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (__ptr == (void *)0x0) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = CoolProp::AbstractState::rhomass_reducing;
            __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          lVar4 = 0;
          do {
            *(double *)((long)__ptr + lVar4 * 8) =
                 local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4] * 1e-06 +
                 local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          lVar4 = 0;
          do {
            dVar1 = *(double *)((long)__ptr + lVar4 * 8);
            if (dVar1 < 0.0) break;
            bVar5 = lVar4 != 3;
            lVar4 = lVar4 + 1;
          } while (bVar5);
          free(__ptr);
          if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_28.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_28.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (double *)0x0) {
            operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_40.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_40.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          return *(double *)(&DAT_001740d0 + (ulong)(dVar1 < 0.0) * 8);
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x198,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
               );
}

Assistant:

double determine_c_parametric() {
        if (mode == STEP_PARAMETRIC) {
            std::vector<TYPE> rhovec(m_initial_state.rhovecL.size()*2);
            rhovec[0] = m_initial_state.rhovecL[0];
            rhovec[1] = m_initial_state.rhovecL[1];
            rhovec[2] = m_initial_state.rhovecV[0];
            rhovec[3] = m_initial_state.rhovecV[1];
            std::vector<TYPE> f(rhovec.size());
            derivs(m_T, rhovec, f);
            double dt = 1e-6;
            Eigen::ArrayXd newrho(4);
            for (auto i = 0; i < 4; ++i) {
                newrho[i] = rhovec[i] + dt * f[i];
            }
            if ((newrho < 0).any()) {
                return -1;
            }
            else{
                return 1;
            }
        }
        else {
            return 1.0;
        }
    }